

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

bool __thiscall
mp::internal::TextReader<fmt::Locale>::DoReadOptionalInt<short>
          (TextReader<fmt::Locale> *this,short *value)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  unsigned_short uVar4;
  UInt result;
  unsigned_short local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  ArgList local_30;
  
  SkipSpace(this);
  pcVar2 = (this->super_ReaderBase).ptr_;
  cVar1 = *pcVar2;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    (this->super_ReaderBase).ptr_ = pcVar2 + 1;
  }
  local_4a = 0;
  bVar3 = ReadIntWithoutSign<unsigned_short>(this,&local_4a);
  if (bVar3) {
    if (((short)local_4a < 0) && (cVar1 != '-' || local_4a != 0x8000)) {
      local_30.field_1.values_ = (Value *)&local_48;
      local_48 = 0;
      uStack_40 = 0;
      local_30.types_ = 0;
      DoReportError(this,(this->super_ReaderBase).token_,(CStringRef)0x16f57f,&local_30);
    }
    uVar4 = -local_4a;
    if (cVar1 != '-') {
      uVar4 = local_4a;
    }
    *value = uVar4;
  }
  return bVar3;
}

Assistant:

bool DoReadOptionalInt(Int &value) {
    SkipSpace();
    char sign = *ptr_;
    if (sign == '+' || sign == '-')
      ++ptr_;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    if (!ReadIntWithoutSign<UInt>(result))
      return false;
    UInt max = std::numeric_limits<Int>::max();
    if (result > max && !(sign == '-' && result == max + 1))
      ReportError("number is too big");
    value = sign != '-' ? result : 0 - result;
    return true;
  }